

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::FailFromInternalError(int fd)

{
  int *piVar1;
  ostream *poVar2;
  bool bVar3;
  string local_178 [32];
  GTestLog local_158;
  int local_154;
  undefined1 local_150 [4];
  int last_error;
  GTestLog local_130 [5];
  int local_11c;
  char local_118 [4];
  int num_read;
  char buffer [256];
  Message error;
  int fd_local;
  
  Message::Message((Message *)(buffer + 0xf8));
  do {
    while (local_11c = posix::Read(fd,local_118,0xff), 0 < local_11c) {
      local_118[local_11c] = '\0';
      Message::operator<<((Message *)(buffer + 0xf8),(char (*) [256])local_118);
    }
    bVar3 = false;
    if (local_11c == -1) {
      piVar1 = __errno_location();
      bVar3 = *piVar1 == 4;
    }
  } while (bVar3);
  if (local_11c == 0) {
    GTestLog::GTestLog(local_130,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/gtest/gtest-all.cc"
                       ,0x1aa3);
    poVar2 = GTestLog::GetStream(local_130);
    Message::GetString_abi_cxx11_((string *)local_150,(Message *)(buffer + 0xf8));
    std::operator<<(poVar2,(string *)local_150);
    std::__cxx11::string::~string((string *)local_150);
    GTestLog::~GTestLog(local_130);
  }
  else {
    piVar1 = __errno_location();
    local_154 = *piVar1;
    GTestLog::GTestLog(&local_158,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/gtest/gtest-all.cc"
                       ,0x1aa6);
    poVar2 = GTestLog::GetStream(&local_158);
    poVar2 = std::operator<<(poVar2,"Error while reading death test internal: ");
    GetLastErrnoDescription_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,local_178);
    poVar2 = std::operator<<(poVar2," [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_154);
    std::operator<<(poVar2,"]");
    std::__cxx11::string::~string(local_178);
    GTestLog::~GTestLog(&local_158);
  }
  Message::~Message((Message *)(buffer + 0xf8));
  return;
}

Assistant:

static void FailFromInternalError(int fd) {
  Message error;
  char buffer[256];
  int num_read;

  do {
    while ((num_read = posix::Read(fd, buffer, 255)) > 0) {
      buffer[num_read] = '\0';
      error << buffer;
    }
  } while (num_read == -1 && errno == EINTR);

  if (num_read == 0) {
    GTEST_LOG_(FATAL) << error.GetString();
  } else {
    const int last_error = errno;
    GTEST_LOG_(FATAL) << "Error while reading death test internal: "
                      << GetLastErrnoDescription() << " [" << last_error << "]";
  }
}